

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketHandshake.h
# Opt level: O1

void uWS::WebSocketHandshake::generate(char *input,char *output)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  int i;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  uint32_t uVar7;
  uint32_t b_input [16];
  static_for<16,_uWS::WebSocketHandshake::Sha1Loop<1>_> local_f9;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined8 uStack_f0;
  undefined4 local_e8;
  uint32_t local_d8;
  int local_d4;
  int iStack_d0;
  int iStack_cc;
  int iStack_c8;
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  uint32_t local_a8 [12];
  char local_78 [16];
  undefined1 local_68 [16];
  undefined1 auStack_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [12];
  undefined4 uStack_2c;
  
  _local_f8 = 0xefcdab8967452301;
  uStack_f0 = 0x1032547698badcfe;
  local_e8 = 0xc3d2e1f0;
  builtin_strncpy(local_78,"BA5C8CD011B5",0xd);
  local_78[0xd] = '\0';
  local_78[0xe] = '\0';
  local_78[0xf] = -0x80;
  local_a8[8] = 0x2d453931;
  local_a8[9] = 0x342d3437;
  local_a8[10] = 0x44412d39;
  local_a8[0xb] = 0x3543412d;
  local_a8[4] = 0;
  local_a8[5] = 0;
  local_a8[6] = 0x32353845;
  local_a8[7] = 0x41464135;
  local_a8[0] = 0;
  local_a8[1] = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  lVar4 = 0;
  do {
    uVar3 = *(uint *)(input + lVar4 * 4);
    local_a8[lVar4] =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  local_b8 = -0x10325477;
  iStack_b4 = -0x67452302;
  iStack_b0 = -0x10325477;
  iStack_ac = 0x67452301;
  local_68._8_4_ = 0x98badcfe;
  local_68._0_8_ = 0xefcdab89c3d2e1f0;
  local_68._12_4_ = 0xefcdab89;
  auStack_58._0_4_ = 0x67452301;
  static_for<16,_uWS::WebSocketHandshake::Sha1Loop<1>_>::operator()
            ((static_for<16,_uWS::WebSocketHandshake::Sha1Loop<1>_> *)&local_d8,(uint32_t *)local_68
             ,local_a8);
  static_for<4,_uWS::WebSocketHandshake::Sha1Loop<2>_>::operator()
            ((static_for<4,_uWS::WebSocketHandshake::Sha1Loop<2>_> *)&local_d8,(uint32_t *)local_68,
             local_a8);
  static_for<20,_uWS::WebSocketHandshake::Sha1Loop<3>_>::operator()
            ((static_for<20,_uWS::WebSocketHandshake::Sha1Loop<3>_> *)&local_d8,(uint32_t *)local_68
             ,local_a8);
  static_for<20,_uWS::WebSocketHandshake::Sha1Loop<4>_>::operator()
            ((static_for<20,_uWS::WebSocketHandshake::Sha1Loop<4>_> *)&local_d8,(uint32_t *)local_68
             ,local_a8);
  static_for<20,_uWS::WebSocketHandshake::Sha1Loop<5>_>::operator()
            ((static_for<20,_uWS::WebSocketHandshake::Sha1Loop<5>_> *)&local_d8,(uint32_t *)local_68
             ,local_a8);
  local_d4 = local_68._4_4_ + local_b8;
  iStack_d0 = local_68._8_4_ + iStack_b4;
  iStack_cc = local_68._12_4_ + iStack_b0;
  iStack_c8 = auStack_58._0_4_ + iStack_ac;
  _local_f8 = CONCAT44(iStack_cc,iStack_c8);
  uStack_f0 = CONCAT44(local_d4,iStack_d0);
  uVar7 = local_68._0_4_ + 0xc3d2e1f0;
  local_48 = (undefined1  [16])0x0;
  auStack_58 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_38 = SUB1612((undefined1  [16])0x0,0);
  uStack_2c = 0x1e0;
  local_e8 = uVar7;
  local_d8 = uVar7;
  local_b8 = local_d4;
  iStack_b4 = iStack_d0;
  iStack_b0 = iStack_cc;
  iStack_ac = iStack_c8;
  static_for<16,_uWS::WebSocketHandshake::Sha1Loop<1>_>::operator()
            (&local_f9,&local_d8,(uint32_t *)local_68);
  static_for<4,_uWS::WebSocketHandshake::Sha1Loop<2>_>::operator()
            ((static_for<4,_uWS::WebSocketHandshake::Sha1Loop<2>_> *)&local_f9,&local_d8,
             (uint32_t *)local_68);
  static_for<20,_uWS::WebSocketHandshake::Sha1Loop<3>_>::operator()
            ((static_for<20,_uWS::WebSocketHandshake::Sha1Loop<3>_> *)&local_f9,&local_d8,
             (uint32_t *)local_68);
  static_for<20,_uWS::WebSocketHandshake::Sha1Loop<4>_>::operator()
            ((static_for<20,_uWS::WebSocketHandshake::Sha1Loop<4>_> *)&local_f9,&local_d8,
             (uint32_t *)local_68);
  static_for<20,_uWS::WebSocketHandshake::Sha1Loop<5>_>::operator()
            ((static_for<20,_uWS::WebSocketHandshake::Sha1Loop<5>_> *)&local_f9,&local_d8,
             (uint32_t *)local_68);
  _local_f8 = CONCAT44(iStack_cc + iStack_b0,iStack_c8 + iStack_ac);
  uStack_f0 = CONCAT44(local_d4 + local_b8,iStack_d0 + iStack_b4);
  local_e8 = uVar7 + local_d8;
  lVar4 = 0;
  do {
    uVar3 = (&local_f8)[lVar4];
    (&local_f8)[lVar4] =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  uVar5 = 0xfffffffffffffffd;
  do {
    pcVar6 = output;
    bVar1 = *(byte *)((long)&local_f8 + uVar5 + 3);
    *pcVar6 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 >> 2];
    bVar2 = *(byte *)((long)&uStack_f4 + uVar5);
    pcVar6[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                [(uint)(bVar2 >> 4) | (bVar1 & 3) << 4];
    bVar1 = *(byte *)((long)&uStack_f4 + uVar5 + 1);
    pcVar6[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                [(uint)(bVar1 >> 6) + (bVar2 & 0xf) * 4];
    pcVar6[3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 & 0x3f];
    uVar5 = uVar5 + 3;
    output = pcVar6 + 4;
  } while (uVar5 < 0xf);
  pcVar6[4] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
              [local_e8._2_1_ >> 2];
  pcVar6[5] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
              [(uint)(local_e8._3_1_ >> 4) | (local_e8._2_1_ & 3) << 4];
  pcVar6[6] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
              [(ulong)(local_e8._3_1_ & 0xf) * 4];
  pcVar6[7] = '=';
  return;
}

Assistant:

static inline void generate(const char input[24], char output[28]) {
        uint32_t b_output[5] = {
            0x67452301, 0xefcdab89, 0x98badcfe, 0x10325476, 0xc3d2e1f0
        };
        uint32_t b_input[16] = {
            0, 0, 0, 0, 0, 0, 0x32353845, 0x41464135, 0x2d453931, 0x342d3437, 0x44412d39,
            0x3543412d, 0x43354142, 0x30444338, 0x35423131, 0x80000000
        };

        for (int i = 0; i < 6; i++) {
            b_input[i] = (input[4 * i + 3] & 0xff) | (input[4 * i + 2] & 0xff) << 8 | (input[4 * i + 1] & 0xff) << 16 | (input[4 * i + 0] & 0xff) << 24;
        }
        sha1(b_output, b_input);
        uint32_t last_b[16] = {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 480};
        sha1(b_output, last_b);
        for (int i = 0; i < 5; i++) {
            uint32_t tmp = b_output[i];
            char *bytes = (char *) &b_output[i];
            bytes[3] = (char) (tmp & 0xff);
            bytes[2] = (char) ((tmp >> 8) & 0xff);
            bytes[1] = (char) ((tmp >> 16) & 0xff);
            bytes[0] = (char) ((tmp >> 24) & 0xff);
        }
        base64((unsigned char *) b_output, output);
    }